

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WindowCompare(Parse *pParse,Window *p1,Window *p2)

{
  int iVar1;
  Window *p2_local;
  Window *p1_local;
  Parse *pParse_local;
  
  if (p1->eType == p2->eType) {
    if (p1->eStart == p2->eStart) {
      if (p1->eEnd == p2->eEnd) {
        iVar1 = sqlite3ExprCompare(pParse,p1->pStart,p2->pStart,-1);
        if (iVar1 == 0) {
          iVar1 = sqlite3ExprCompare(pParse,p1->pEnd,p2->pEnd,-1);
          if (iVar1 == 0) {
            iVar1 = sqlite3ExprListCompare(p1->pPartition,p2->pPartition,-1);
            if (iVar1 == 0) {
              iVar1 = sqlite3ExprListCompare(p1->pOrderBy,p2->pOrderBy,-1);
              if (iVar1 == 0) {
                pParse_local._4_4_ = 0;
              }
              else {
                pParse_local._4_4_ = 1;
              }
            }
            else {
              pParse_local._4_4_ = 1;
            }
          }
          else {
            pParse_local._4_4_ = 1;
          }
        }
        else {
          pParse_local._4_4_ = 1;
        }
      }
      else {
        pParse_local._4_4_ = 1;
      }
    }
    else {
      pParse_local._4_4_ = 1;
    }
  }
  else {
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowCompare(Parse *pParse, Window *p1, Window *p2){
  if( p1->eType!=p2->eType ) return 1;
  if( p1->eStart!=p2->eStart ) return 1;
  if( p1->eEnd!=p2->eEnd ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pStart, p2->pStart, -1) ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pEnd, p2->pEnd, -1) ) return 1;
  if( sqlite3ExprListCompare(p1->pPartition, p2->pPartition, -1) ) return 1;
  if( sqlite3ExprListCompare(p1->pOrderBy, p2->pOrderBy, -1) ) return 1;
  return 0;
}